

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void __thiscall
de::cmdline::Option<tcu::opt::CLPlatformID>::Option
          (Option<tcu::opt::CLPlatformID> *this,char *shortName_,char *longName_,char *description_,
          char *defaultValue_)

{
  char *defaultValue__local;
  char *description__local;
  char *longName__local;
  char *shortName__local;
  Option<tcu::opt::CLPlatformID> *this_local;
  
  this->shortName = shortName_;
  this->longName = longName_;
  this->description = description_;
  this->defaultValue = defaultValue_;
  this->parse = parseType<int>;
  this->namedValues = (NamedValue<int> *)0x0;
  this->namedValuesEnd = (NamedValue<int> *)0x0;
  return;
}

Assistant:

Option (const char* shortName_, const char* longName_, const char* description_, const char* defaultValue_ = DE_NULL)
		: shortName		(shortName_)
		, longName		(longName_)
		, description	(description_)
		, defaultValue	(defaultValue_)
		, parse			(parseType<ValueType>)
		, namedValues	(DE_NULL)
		, namedValuesEnd(0)
	{
	}